

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O0

void __thiscall Disa::Matrix_Sparse::resize(Matrix_Sparse *this,size_t *row,size_t *column)

{
  ulong uVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *p_Var2;
  bool bVar3;
  size_t sVar4;
  reference pvVar5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *p_Var6;
  value_type local_138;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_100;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_f8;
  const_iterator local_f0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_e8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_e0;
  const_iterator local_d8;
  unsigned_long *local_d0;
  const_iterator local_c8;
  const_iterator local_c0;
  unsigned_long *local_b8;
  unsigned_long *local_b0;
  difference_type local_a8;
  difference_type *local_a0;
  s_size_t *end_distance;
  unsigned_long *local_90;
  difference_type local_88;
  difference_type *local_80;
  s_size_t *start_distance;
  unsigned_long *local_70;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_68;
  unsigned_long *local_60;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_58;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  iter_column;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_48;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *local_40;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *iter_column_end;
  size_t i_row;
  size_t offset_loss;
  ulong *local_20;
  size_t *column_local;
  size_t *row_local;
  Matrix_Sparse *this_local;
  
  uVar1 = *row;
  local_20 = column;
  column_local = row;
  row_local = (size_t *)this;
  sVar4 = size_row(this);
  if (uVar1 < sVar4) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->row_non_zero,*column_local);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->column_index,*pvVar5);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->row_non_zero,*column_local);
    std::vector<double,_std::allocator<double>_>::resize(&this->element_value,*pvVar5);
  }
  sVar4 = *column_local;
  bVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(&this->row_non_zero);
  if (bVar3) {
    local_138 = 0;
  }
  else {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->row_non_zero);
    local_138 = *pvVar5;
  }
  offset_loss = local_138;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->row_non_zero,sVar4 + 1,&offset_loss);
  uVar1 = *local_20;
  sVar4 = size_column(this);
  if (uVar1 < sVar4) {
    i_row = 0;
    for (iter_column_end =
              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               *)0x0; p_Var2 = iter_column_end,
        p_Var6 = (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)size_row(this), p_Var2 < p_Var6;
        iter_column_end =
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)((long)&iter_column_end->_M_current + 1)) {
      iter_column._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->column_index);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->row_non_zero,(size_type)((long)&iter_column_end->_M_current + 1));
      local_48 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator+(&iter_column,*pvVar5 - i_row);
      local_40 = &local_48;
      local_68._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->column_index);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->row_non_zero,(size_type)iter_column_end);
      local_60 = (unsigned_long *)
                 __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator+(&local_68,*pvVar5);
      local_70 = local_40->_M_current;
      start_distance = (s_size_t *)(*local_20 - 1);
      local_58 = std::
                 upper_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                           ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )local_60,local_70,(unsigned_long *)&start_distance);
      bVar3 = __gnu_cxx::
              operator==<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        (&local_58,local_40);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        local_90 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             (&this->column_index);
        end_distance = (s_size_t *)local_58._M_current;
        local_88 = std::
                   distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                             ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               )local_90,local_58);
        local_80 = &local_88;
        local_b0 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             (&this->column_index);
        local_b8 = local_40->_M_current;
        local_a8 = std::
                   distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                             ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               )local_b0,
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               )local_b8);
        local_a0 = &local_a8;
        __gnu_cxx::
        __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
        ::__normal_iterator<unsigned_long*>
                  ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    *)&local_c0,&local_58);
        __gnu_cxx::
        __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
        ::__normal_iterator<unsigned_long*>
                  ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    *)&local_c8,local_40);
        local_d0 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                             (&this->column_index,local_c0,local_c8);
        local_e8._M_current =
             (double *)std::vector<double,_std::allocator<double>_>::begin(&this->element_value);
        local_e0 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator+(&local_e8,*local_80);
        __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
        __normal_iterator<double*>
                  ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
                   &local_d8,&local_e0);
        local_100._M_current =
             (double *)std::vector<double,_std::allocator<double>_>::begin(&this->element_value);
        local_f8 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator+(&local_100,*local_a0);
        __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
        __normal_iterator<double*>
                  ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
                   &local_f0,&local_f8);
        std::vector<double,_std::allocator<double>_>::erase(&this->element_value,local_d8,local_f0);
        i_row = (*local_a0 - *local_80) + i_row;
      }
      sVar4 = i_row;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->row_non_zero,(size_type)((long)&iter_column_end->_M_current + 1));
      *pvVar5 = *pvVar5 - sVar4;
    }
  }
  this->column_size = *local_20;
  return;
}

Assistant:

void Matrix_Sparse::resize(const std::size_t& row, const std::size_t& column) {

  // resize rows first
  if(row < size_row()) {
    column_index.resize(row_non_zero[row]);
    element_value.resize(row_non_zero[row]);
  }
  row_non_zero.resize(row + 1, row_non_zero.empty() ? 0 : row_non_zero.back());

  // resize columns
  // Note: Since we may have to do column erases over multiple rows we do it directly here rather than use erase().
  if(column < size_column()) {
    std::size_t offset_loss = 0;
    FOR(i_row, size_row()) {
      const auto& iter_column_end = column_index.begin() + static_cast<s_size_t>(row_non_zero[i_row + 1] - offset_loss);
      auto iter_column =
      std::upper_bound(column_index.begin() + static_cast<s_size_t>(row_non_zero[i_row]), iter_column_end, column - 1);
      if(iter_column != iter_column_end) {
        const s_size_t& start_distance = std::distance(column_index.begin(), iter_column);
        const s_size_t& end_distance = std::distance(column_index.begin(), iter_column_end);
        column_index.erase(iter_column, iter_column_end);
        element_value.erase(element_value.begin() + start_distance, element_value.begin() + end_distance);
        offset_loss += end_distance - start_distance;
      }
      row_non_zero[i_row + 1] -= offset_loss;
    }
  }
  column_size = column;
}